

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int memParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int local_54;
  int ret;
  int res;
  int size;
  char *base;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  char *pcStack_28;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  local_54 = 0;
  ctxt._4_4_ = options | 0x40;
  nb_tests = nb_tests + 1;
  pcStack_28 = err;
  err_local = result;
  result_local = filename;
  iVar1 = loadMem(filename,(char **)&res,&ret);
  if (iVar1 == 0) {
    doc = (xmlDocPtr)xmlNewParserCtxt();
    base = (char *)xmlCtxtReadMemory(doc,_res,ret,result_local,0,ctxt._4_4_);
    unloadMem(_res);
    if (base == (char *)0x0) {
      filename_local._4_4_ = 1;
    }
    else {
      xmlDocDumpMemory(base,&res,&ret);
      iVar1 = compareFileMem(err_local,_res,ret);
      if ((_res == (char *)0x0) || (iVar1 != 0)) {
        fprintf(_stderr,"Result for %s failed in %s\n",result_local,err_local);
        local_54 = -1;
      }
      iVar1 = testParseContent((xmlParserCtxtPtr)doc,(xmlDocPtr)base,result_local);
      if (iVar1 < 0) {
        local_54 = -1;
      }
      xmlFreeDoc(base);
      xmlFreeParserCtxt(doc);
      (*_xmlFree)(_res);
      filename_local._4_4_ = local_54;
    }
  }
  else {
    fprintf(_stderr,"Failed to load %s\n",result_local);
    filename_local._4_4_ = -1;
  }
  return filename_local._4_4_;
}

Assistant:

static int
memParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    const char *base;
    int size, res;
    int ret = 0;

    options |= XML_PARSE_NOWARNING;

    nb_tests++;
    /*
     * load and parse the memory
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    ctxt = xmlNewParserCtxt();
    doc = xmlCtxtReadMemory(ctxt, base, size, filename, NULL, options);
    unloadMem(base);
    if (doc == NULL) {
        return(1);
    }
    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    res = compareFileMem(result, base, size);
    if ((base == NULL) || (res != 0)) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	ret = -1;
    }

    if (testParseContent(ctxt, doc, filename) < 0)
	ret = -1;

    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);
    xmlFree((char *)base);
    return(ret);
}